

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asset-resolution.cc
# Opt level: O2

bool __thiscall
tinyusdz::AssetResolutionResolver::open_asset
          (AssetResolutionResolver *this,string *resolvedPath,string *assetPath,Asset *asset_out,
          string *warn,string *err)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
  *this_00;
  void *pvVar1;
  int iVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  bool bVar5;
  uint64_t read_size;
  uint64_t sz;
  string ext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint64_t local_d8;
  uint64_t local_d0;
  string local_c8;
  Asset local_a8;
  
  if (asset_out != (Asset *)0x0) {
    io::GetFileExtension(&local_c8,(string *)resolvedPath);
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               *)(this + 0x48);
    sVar3 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
            ::count(this_00,&local_c8);
    if (((sVar3 == 0) ||
        (pmVar4 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                  ::at(this_00,&local_c8), pmVar4->size_fun == (FSSizeAsset)0x0)) ||
       (pmVar4 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                 ::at(this_00,&local_c8), pmVar4->read_fun == (FSReadAsset)0x0)) {
      local_a8.version_.field_2._M_allocated_capacity = 0;
      local_a8.version_._M_dataplus._M_p = (pointer)0x0;
      local_a8.version_._M_string_length = 0;
      bVar5 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
                                (string *)err,(string *)resolvedPath,*(long *)(this + 0x40) << 0x14,
                                (void *)0x0);
      if (bVar5) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_out->buf_,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
      }
      else if (err != (string *)0x0) {
        ::std::__cxx11::string::append((char *)err);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
    }
    else {
      pmVar4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at(this_00,&local_c8);
      pvVar1 = pmVar4->userdata;
      local_d0 = 0;
      pmVar4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at(this_00,&local_c8);
      iVar2 = (*pmVar4->size_fun)((resolvedPath->_M_dataplus)._M_p,&local_d0,err,pvVar1);
      if (iVar2 == 0) {
        local_a8.version_._M_dataplus._M_p = (pointer)&local_a8.version_.field_2;
        local_a8.version_._M_string_length = 0;
        local_a8.version_.field_2._M_allocated_capacity =
             local_a8.version_.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_a8.name_._M_dataplus._M_p = (pointer)&local_a8.name_.field_2;
        local_a8.name_._M_string_length = 0;
        local_a8.name_.field_2._M_local_buf[0] = '\0';
        local_a8.resolved_name_._M_dataplus._M_p = (pointer)&local_a8.resolved_name_.field_2;
        local_a8.resolved_name_._M_string_length = 0;
        local_a8.resolved_name_.field_2._M_local_buf[0] = '\0';
        local_a8.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (uint8_t *)0x0;
        local_a8.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_a8.buf_,local_d0);
        local_d8 = 0;
        pmVar4 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                 ::at(this_00,&local_c8);
        iVar2 = (*pmVar4->read_fun)((resolvedPath->_M_dataplus)._M_p,
                                    (long)local_a8.buf_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_a8.buf_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                    local_a8.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,&local_d8,err,pvVar1);
        bVar5 = iVar2 == 0;
        if (bVar5) {
          if (local_d8 < local_d0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_a8.buf_,local_d8);
          }
          Asset::operator=(asset_out,&local_a8);
        }
        else if (err != (string *)0x0) {
          ::std::__cxx11::string::append((char *)err);
        }
        Asset::~Asset(&local_a8);
      }
      else {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::append((char *)err);
        }
        bVar5 = false;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    return bVar5;
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::string::assign((char *)err);
  }
  return false;
}

Assistant:

bool AssetResolutionResolver::open_asset(const std::string &resolvedPath, const std::string &assetPath,
                  Asset *asset_out, std::string *warn, std::string *err) const {

  if (!asset_out) {
    if (err) {
      (*err) = "`asset` arg is nullptr.";
    }
    return false;
  }

  DCOUT("Opening asset: " << resolvedPath);

  (void)assetPath;
  (void)warn;

  std::string ext = io::GetFileExtension(resolvedPath);

  if (_asset_resolution_handlers.count(ext)) {
    if (_asset_resolution_handlers.at(ext).size_fun && _asset_resolution_handlers.at(ext).read_fun) {

      // Use custom handler's userdata
      void *userdata = _asset_resolution_handlers.at(ext).userdata;

      // Get asset size.
      uint64_t sz{0};
      int ret = _asset_resolution_handlers.at(ext).size_fun(resolvedPath.c_str(), &sz, err, userdata);
      if (ret != 0) {
        if (err) {
          (*err) += "Get size of asset through handler failed.\n";
        }
        return false;
      }
    
      DCOUT("asset_size: " << sz);

      tinyusdz::Asset asset;
      asset.resize(size_t(sz));

      uint64_t read_size{0};

      ret = _asset_resolution_handlers.at(ext).read_fun(resolvedPath.c_str(), /* req_size */asset.size(), asset.data(), &read_size, err, userdata);

      if (ret != 0) {
        if (err) {
          (*err) += "Read asset through handler failed.\n";
        }
        return false;
      }

      if (read_size < sz) {
        asset.resize(size_t(read_size));
        // May optimize memory usage
        asset.shrink_to_fit();
      }

      (*asset_out) = std::move(asset);

      return true;
    } else {
      DCOUT("Resolve function is nullptr. Fallback to built-in file handler.");
    }
  }

  // Default: read from a file.
  std::vector<uint8_t> data;
  size_t max_bytes = 1024 * 1024 * _max_asset_bytes_in_mb;
  if (!io::ReadWholeFile(&data, err, resolvedPath, max_bytes,
                           /* userdata */ nullptr)) {

    if (err) {
      (*err) += "Open asset from a file failed.\n";
    }

    return false;
  }

  asset_out->set_data(std::move(data));

  return true;
}